

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger get_slice_params(HSQUIRRELVM v,SQInteger *sidx,SQInteger *eidx,SQObjectPtr *o)

{
  SQInteger SVar1;
  SQObjectPtr *pSVar2;
  SQObjectValue SVar3;
  SQObjectValue *in_RDX;
  undefined8 *in_RSI;
  HSQUIRRELVM in_RDI;
  SQObjectPtr *end;
  SQObjectPtr *start;
  SQInteger top;
  SQInteger in_stack_ffffffffffffffb8;
  HSQUIRRELVM in_stack_ffffffffffffffc0;
  HSQUIRRELVM in_stack_ffffffffffffffc8;
  SQObjectPtr *in_stack_ffffffffffffffd0;
  
  SVar1 = sq_gettop(in_RDI);
  *in_RSI = 0;
  in_RDX->pTable = (SQTable *)0x0;
  stack_get(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  SQObjectPtr::operator=(in_stack_ffffffffffffffd0,(SQObjectPtr *)in_stack_ffffffffffffffc8);
  if (((1 < SVar1) &&
      (pSVar2 = stack_get(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8),
      (pSVar2->super_SQObject)._type != OT_NULL)) &&
     (((pSVar2->super_SQObject)._type & 0x4000000) != 0)) {
    if ((pSVar2->super_SQObject)._type == OT_FLOAT) {
      in_stack_ffffffffffffffc0 = (HSQUIRRELVM)(long)(pSVar2->super_SQObject)._unVal.fFloat;
    }
    else {
      in_stack_ffffffffffffffc0 = (HSQUIRRELVM)(pSVar2->super_SQObject)._unVal.pTable;
    }
    *in_RSI = in_stack_ffffffffffffffc0;
  }
  if (SVar1 < 3) {
    SVar1 = sq_getsize(in_stack_ffffffffffffffc8,(SQInteger)in_stack_ffffffffffffffc0);
    in_RDX->nInteger = SVar1;
  }
  else {
    pSVar2 = stack_get(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if (((pSVar2->super_SQObject)._type & 0x4000000) != 0) {
      if ((pSVar2->super_SQObject)._type == OT_FLOAT) {
        SVar3.nInteger = (SQInteger)(pSVar2->super_SQObject)._unVal.fFloat;
      }
      else {
        SVar3 = (pSVar2->super_SQObject)._unVal;
      }
      in_RDX->nInteger = (SQInteger)SVar3;
    }
  }
  return 1;
}

Assistant:

static SQInteger get_slice_params(HSQUIRRELVM v,SQInteger &sidx,SQInteger &eidx,SQObjectPtr &o)
{
    SQInteger top = sq_gettop(v);
    sidx=0;
    eidx=0;
    o=stack_get(v,1);
    if(top>1){
        SQObjectPtr &start=stack_get(v,2);
        if(sq_type(start)!=OT_NULL && sq_isnumeric(start)){
            sidx=tointeger(start);
        }
    }
    if(top>2){
        SQObjectPtr &end=stack_get(v,3);
        if(sq_isnumeric(end)){
            eidx=tointeger(end);
        }
    }
    else {
        eidx = sq_getsize(v,1);
    }
    return 1;
}